

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::
       parse_width<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
                 *handler)

{
  int width;
  specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
  *in_RDX;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *in_RSI;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *in_RDI;
  char *in_stack_ffffffffffffffb8;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *in_stack_ffffffffffffffc0;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *pdVar1;
  specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
  *in_stack_ffffffffffffffc8;
  width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
  in_stack_ffffffffffffffd8;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *end_00;
  char *in_stack_fffffffffffffff8;
  
  if ((*(char *)&(in_RDI->super_specs_setter<char>).specs_ < '0') ||
     ('9' < *(char *)&(in_RDI->super_specs_setter<char>).specs_)) {
    if (*(char *)&(in_RDI->super_specs_setter<char>).specs_ == '{') {
      pdVar1 = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                *)((long)&(in_RDI->super_specs_setter<char>).specs_ + 1);
      in_RDI = pdVar1;
      if (pdVar1 != in_RSI) {
        end_00 = pdVar1;
        width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
        ::width_adapter((width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
                         *)&stack0xffffffffffffffd8,in_RDX);
        in_RDI = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                  *)parse_arg_id<char,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&,char>>
                              (in_stack_fffffffffffffff8,(char *)end_00,
                               (width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
                                *)in_RSI);
        in_stack_ffffffffffffffc0 = pdVar1;
      }
      if ((in_RDI == in_RSI) || (*(char *)&(in_RDI->super_specs_setter<char>).specs_ != '}')) {
        dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
        ::on_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        in_RDI = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                  *)((long)&(in_RDI->super_specs_setter<char>).specs_ + 1);
      }
    }
  }
  else {
    width = parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                      ((char **)in_stack_ffffffffffffffd8.handler,(char *)in_RDX,
                       in_stack_ffffffffffffffc8);
    specs_setter<char>::on_width((specs_setter<char> *)in_RDX,width);
  }
  return (char *)in_RDI;
}

Assistant:

FMT_CONSTEXPR const Char* parse_width(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}